

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_1::TestVertShader::shadeVertices
          (TestVertShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int instanceNdx_00;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  undefined8 local_6c;
  undefined8 local_64;
  undefined1 local_5c [8];
  Vec4 color2;
  Vec4 color;
  Vec4 position;
  int instanceNdx;
  int packetNdx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  TestVertShader *this_local;
  
  for (position.m_data[3] = 0.0; (int)position.m_data[3] < numPackets;
      position.m_data[3] = (float)((int)position.m_data[3] + 1)) {
    instanceNdx_00 = packets[(int)position.m_data[3]]->instanceNdx + this->m_firstInstance;
    rr::readVertexAttribFloat
              ((rr *)(color.m_data + 2),inputs,instanceNdx_00,
               packets[(int)position.m_data[3]]->vertexNdx);
    rr::readVertexAttribFloat
              ((rr *)(color2.m_data + 2),inputs + 1,instanceNdx_00,
               packets[(int)position.m_data[3]]->vertexNdx);
    rr::readVertexAttribFloat
              ((rr *)local_5c,inputs + 2,instanceNdx_00,packets[(int)position.m_data[3]]->vertexNdx)
    ;
    tcu::Vector<float,_4>::Vector
              (&local_7c,
               ((float)packets[(int)position.m_data[3]]->instanceNdx * 2.0) /
               (float)this->m_numInstances,0.0,0.0,0.0);
    tcu::operator+((tcu *)&local_6c,(Vector<float,_4> *)(color.m_data + 2),&local_7c);
    pVVar1 = packets[(int)position.m_data[3]];
    *(undefined8 *)(pVVar1->position).m_data = local_6c;
    *(undefined8 *)((pVVar1->position).m_data + 2) = local_64;
    tcu::Vector<float,_4>::Vector
              (&local_ac,(float)instanceNdx_00 / (float)this->m_numInstances,0.0,0.0,1.0);
    tcu::operator+((tcu *)&local_9c,(Vector<float,_4> *)(color2.m_data + 2),&local_ac);
    tcu::operator+((tcu *)&local_8c,&local_9c,(Vector<float,_4> *)local_5c);
    rr::GenericVec4::operator=(packets[(int)position.m_data[3]]->outputs,&local_8c);
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs,
						rr::VertexPacket* const* packets,
						const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			const int		instanceNdx		= packets[packetNdx]->instanceNdx + m_firstInstance;
			const tcu::Vec4	position		= rr::readVertexAttribFloat(inputs[0], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color			= rr::readVertexAttribFloat(inputs[1], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color2			= rr::readVertexAttribFloat(inputs[2], instanceNdx, packets[packetNdx]->vertexNdx);
			packets[packetNdx]->position	= position + tcu::Vec4((float)(packets[packetNdx]->instanceNdx * 2.0 / m_numInstances), 0.0, 0.0, 0.0);
			packets[packetNdx]->outputs[0]	= color + tcu::Vec4((float)instanceNdx / (float)m_numInstances, 0.0, 0.0, 1.0) + color2;
		}
	}